

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

char * __thiscall
gl4cts::GPUShaderFP64Test9::getOperatorForOperationType
          (GPUShaderFP64Test9 *this,_operation_type *operation_type)

{
  TestError *this_00;
  char *local_20;
  char *result;
  _operation_type *operation_type_local;
  GPUShaderFP64Test9 *this_local;
  
  switch(*operation_type) {
  case OPERATION_TYPE_ADDITION:
    local_20 = "+";
    break;
  case OPERATION_TYPE_DIVISION:
    local_20 = "/";
    break;
  case OPERATION_TYPE_MULTIPLICATION:
    local_20 = "*";
    break;
  case OPERATION_TYPE_SUBTRACTION:
    local_20 = "-";
    break;
  case OPERATION_TYPE_PRE_DECREMENTATION:
  case OPERATION_TYPE_POST_DECREMENTATION:
    local_20 = "--";
    break;
  case OPERATION_TYPE_PRE_INCREMENTATION:
  case OPERATION_TYPE_POST_INCREMENTATION:
    local_20 = "++";
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized operation type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x2c5e);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_20;
}

Assistant:

const char* GPUShaderFP64Test9::getOperatorForOperationType(const _operation_type& operation_type)
{
	const char* result = NULL;

	switch (operation_type)
	{
	case OPERATION_TYPE_ADDITION:
		result = "+";
		break;
	case OPERATION_TYPE_DIVISION:
		result = "/";
		break;
	case OPERATION_TYPE_MULTIPLICATION:
		result = "*";
		break;
	case OPERATION_TYPE_SUBTRACTION:
		result = "-";
		break;

	case OPERATION_TYPE_PRE_DECREMENTATION:
	case OPERATION_TYPE_POST_DECREMENTATION:
	{
		result = "--";

		break;
	}

	case OPERATION_TYPE_PRE_INCREMENTATION:
	case OPERATION_TYPE_POST_INCREMENTATION:
	{
		result = "++";

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized operation type");
	}
	} /* switch(operation_type) */

	return result;
}